

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signed-interest.c
# Opt level: O0

int ndn_signed_interest_ecdsa_verify(ndn_interest_t *interest,ndn_ecc_pub_t *pub_key)

{
  uint uVar1;
  uint32_t input_size;
  _Bool _Var2;
  int iVar3;
  int result;
  uint32_t siginfo_block_ending;
  uint32_t param_block_starting;
  uint8_t i;
  ndn_encoder_t temp_encoder;
  uint8_t be_signed [680];
  int ret_val;
  ndn_ecc_pub_t *pub_key_local;
  ndn_interest_t *interest_local;
  
  _Var2 = ndn_interest_is_signed(interest);
  if ((_Var2) &&
     ((interest->name).components[(int)((interest->name).components_size - 1)].type == 2)) {
    memset(&temp_encoder.output_max_size,0,0x2a8);
    encoder_init((ndn_encoder_t *)&param_block_starting,(uint8_t *)&temp_encoder.output_max_size,
                 0x2a8);
    for (siginfo_block_ending._3_1_ = 0; uVar1 = temp_encoder.output_value._4_4_,
        (int)(uint)siginfo_block_ending._3_1_ < (int)((interest->name).components_size - 1);
        siginfo_block_ending._3_1_ = siginfo_block_ending._3_1_ + 1) {
      iVar3 = name_component_tlv_encode
                        ((ndn_encoder_t *)&param_block_starting,
                         (interest->name).components + siginfo_block_ending._3_1_);
      if (iVar3 != 0) {
        return iVar3;
      }
    }
    _Var2 = ndn_interest_has_Parameters(interest);
    if (((!_Var2) ||
        (((interest_local._4_4_ = encoder_append_type((ndn_encoder_t *)&param_block_starting,0x24),
          interest_local._4_4_ == 0 &&
          (interest_local._4_4_ =
                encoder_append_length
                          ((ndn_encoder_t *)&param_block_starting,(interest->parameters).size),
          interest_local._4_4_ == 0)) &&
         (interest_local._4_4_ =
               encoder_append_raw_buffer_value
                         ((ndn_encoder_t *)&param_block_starting,(interest->parameters).value,
                          (interest->parameters).size), interest_local._4_4_ == 0)))) &&
       (((interest_local._4_4_ =
               ndn_signature_info_tlv_encode
                         ((ndn_encoder_t *)&param_block_starting,&interest->signature),
         input_size = temp_encoder.output_value._4_4_, interest_local._4_4_ == 0 &&
         (interest_local._4_4_ =
               ndn_signature_value_tlv_encode
                         ((ndn_encoder_t *)&param_block_starting,&interest->signature),
         interest_local._4_4_ == 0)) &&
        (interest_local._4_4_ =
              ndn_ecdsa_verify(_param_block_starting,input_size,(interest->signature).sig_value,
                               (interest->signature).sig_size,pub_key), -1 < interest_local._4_4_)))
       ) {
      iVar3 = ndn_sha256_verify(_param_block_starting + uVar1,
                                temp_encoder.output_value._4_4_ - uVar1,
                                (interest->name).components
                                [(int)((interest->name).components_size - 1)].value,
                                (uint)(interest->name).components
                                      [(int)((interest->name).components_size - 1)].size);
      if (iVar3 < 0) {
        interest_local._4_4_ = -0x1e;
      }
      else {
        interest_local._4_4_ = 0;
      }
    }
  }
  else {
    interest_local._4_4_ = -0x11;
  }
  return interest_local._4_4_;
}

Assistant:

int
ndn_signed_interest_ecdsa_verify(const ndn_interest_t* interest, const ndn_ecc_pub_t* pub_key)
{
  // check the signed Interest format
  if (!ndn_interest_is_signed(interest) ||
      interest->name.components[interest->name.components_size - 1].type != TLV_ParametersSha256DigestComponent) {
    return NDN_UNSUPPORTED_FORMAT;
  }
  int ret_val = -1;
  uint8_t be_signed[NDN_SIGNED_INTEREST_BE_SIGNED_MAX_SIZE] = {0};
  ndn_encoder_t temp_encoder;
  encoder_init(&temp_encoder, be_signed, NDN_SIGNED_INTEREST_BE_SIGNED_MAX_SIZE);

  // the signing input starts at Name's Value (V) excluding the ending component
  for (uint8_t i = 0; i < interest->name.components_size - 1; i++) {
    ret_val = name_component_tlv_encode(&temp_encoder, &interest->name.components[i]);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  // the digest input starts at parameters
  uint32_t param_block_starting = temp_encoder.offset;
  if (ndn_interest_has_Parameters(interest)) {
    ret_val = encoder_append_type(&temp_encoder, TLV_ApplicationParameters);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(&temp_encoder, interest->parameters.size);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_raw_buffer_value(&temp_encoder, interest->parameters.value, interest->parameters.size);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  ret_val = ndn_signature_info_tlv_encode(&temp_encoder, &interest->signature);
  if (ret_val != NDN_SUCCESS) return ret_val;
  // the signing input ends at signature info
  uint32_t siginfo_block_ending = temp_encoder.offset;
  ret_val = ndn_signature_value_tlv_encode(&temp_encoder, &interest->signature);
  if (ret_val != NDN_SUCCESS) return ret_val;

  int result = ndn_ecdsa_verify(temp_encoder.output_value, siginfo_block_ending,
                                interest->signature.sig_value, interest->signature.sig_size,
                                pub_key);
  if (result < 0) return result;

  result = ndn_sha256_verify(&temp_encoder.output_value[param_block_starting],
                             temp_encoder.offset - param_block_starting,
                             interest->name.components[interest->name.components_size - 1].value,
                             interest->name.components[interest->name.components_size - 1].size);
  if (result < 0)
    return NDN_SEC_SIGNED_INTEREST_INVALID_DIGEST;
  return NDN_SUCCESS;
}